

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::Data
          (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this,
          Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *other)

{
  undefined8 uVar1;
  long lVar2;
  bool bVar3;
  long in_RSI;
  Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *in_RDI;
  long in_FS_OFFSET;
  R RVar4;
  Node<ProKey,_ProFunctionDef> *newNode;
  Node<ProKey,_ProFunctionDef> *n;
  size_t index;
  Span *span;
  size_t s;
  R r;
  Bucket it;
  QBasicAtomicInteger<int> *in_stack_ffffffffffffff80;
  Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *this_00;
  ulong local_58;
  ulong local_48;
  size_t in_stack_ffffffffffffffc0;
  Span *local_28;
  size_t local_20;
  Bucket local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QBasicAtomicInteger<int>::QBasicAtomicInteger
            (in_stack_ffffffffffffff80,(int)((ulong)in_RDI >> 0x20));
  (((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.ptr = *(char16_t **)(in_RSI + 8);
  (((ProKey *)in_RDI->offsets)->super_ProString).m_string.d.size = *(qsizetype *)(in_RSI + 0x10);
  uVar1 = *(undefined8 *)(in_RSI + 0x18);
  *(int *)(in_RDI->offsets + 0x18) = (int)uVar1;
  *(int *)(in_RDI->offsets + 0x1c) = (int)((ulong)uVar1 >> 0x20);
  *(undefined8 *)&(((ProKey *)in_RDI->offsets)->super_ProString).m_file = 0;
  RVar4 = allocateSpans(in_stack_ffffffffffffffc0);
  local_28 = RVar4.spans;
  *(Span **)&(((ProKey *)in_RDI->offsets)->super_ProString).m_file = local_28;
  local_20 = RVar4.nSpans;
  this_00 = in_RDI;
  for (local_48 = 0; local_48 < local_20; local_48 = local_48 + 1) {
    lVar2 = *(long *)(in_RSI + 0x20);
    for (local_58 = 0; local_58 < 0x80; local_58 = local_58 + 1) {
      bVar3 = Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::hasNode
                        ((Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)
                         (lVar2 + local_48 * 0x90),local_58);
      if (bVar3) {
        Span<QHashPrivate::Node<ProKey,_ProFunctionDef>_>::at(this_00,(size_t)in_RDI);
        local_18.span = (Span *)0xaaaaaaaaaaaaaaaa;
        local_18.index = 0xaaaaaaaaaaaaaaaa;
        Bucket::Bucket(&local_18,(Span *)(*(long *)(this_00->offsets + 0x20) + local_48 * 0x90),
                       local_58);
        Bucket::insert((Bucket *)0x2eb5db);
        Node<ProKey,_ProFunctionDef>::Node
                  ((Node<ProKey,_ProFunctionDef> *)this_00,(Node<ProKey,_ProFunctionDef> *)in_RDI);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

Data(const Data &other) : size(other.size), numBuckets(other.numBuckets), seed(other.seed)
    {
        auto r = allocateSpans(numBuckets);
        spans = r.spans;
        reallocationHelper<false>(other, r.nSpans);
    }